

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.hpp
# Opt level: O2

void diy::kdtree_sampling<Block,diy::Point<float,2u>>
               (Master *master,Assigner *assigner,int dim,ContinuousBounds *domain,
               offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
               points,size_t samples,bool wrap)

{
  Neighbors *this;
  RegularLink<diy::Bounds<float>_> *this_00;
  int iVar1;
  ulong uVar2;
  runtime_error *this_01;
  int i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  basic_string_view<char> bVar6;
  string_view format_str;
  format_args args;
  BlockID self;
  KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> kdtree_partition;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_398;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_358;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_318;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_2d8;
  KDTreePartners partners;
  
  if ((assigner->nblocks_ & assigner->nblocks_ - 1U) != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    kdtree_partition._0_8_ = ZEXT48((uint)assigner->nblocks_);
    bVar6 = fmt::v7::to_string_view<char,_0>
                      ("KD-tree requires a number of blocks that\'s a power of 2, got {}");
    format_str.data_ = (char *)bVar6.size_;
    format_str.size_ = 1;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )samples;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&kdtree_partition;
    fmt::v7::detail::vformat_abi_cxx11_((string *)&partners,(detail *)bVar6.data_,format_str,args);
    std::runtime_error::runtime_error(this_01,(string *)&partners);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = 0;
  uVar2 = 0;
  if (0 < dim) {
    uVar2 = (ulong)(uint)dim;
  }
  for (; lVar4 < (int)((ulong)((long)(master->blocks_).elements_.
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(master->blocks_).elements_.
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3); lVar4 = lVar4 + 1) {
    this_00 = (RegularLink<diy::Bounds<float>_> *)
              (master->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl
              .super__Vector_impl_data._M_start[lVar4];
    RegularLink<diy::Bounds<float>_>::RegularLink
              ((RegularLink<diy::Bounds<float>_> *)&partners,dim,domain,domain);
    RegularLink<diy::Bounds<float>_>::operator=
              (this_00,(RegularLink<diy::Bounds<float>_> *)&partners);
    RegularLink<diy::Bounds<float>_>::~RegularLink((RegularLink<diy::Bounds<float>_> *)&partners);
    if (wrap) {
      self.gid = (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
      self.proc = (master->comm_).rank_;
      this = &(this_00->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
              neighbors_;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        Direction::Direction((Direction *)&partners,dim,0);
        Direction::Direction((Direction *)&kdtree_partition,dim,0);
        *(undefined4 *)
         (partners.decomposer.domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
          _0_8_ + uVar5 * 4) = 0xffffffff;
        *(undefined4 *)(kdtree_partition.points_ + uVar5 * 4) = 0xffffffff;
        Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
                  (this,&self);
        Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
        push_back(&this_00->nbr_bounds_,domain);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                  (&local_2d8,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&partners);
        RegularLink<diy::Bounds<float>_>::add_direction(this_00,(Direction *)&local_2d8);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_2d8);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                  (&local_318,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&kdtree_partition
                  );
        Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                  (&this_00->wrap_,(value_type *)&local_318);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_318);
        *(undefined4 *)
         (partners.decomposer.domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
          _0_8_ + uVar5 * 4) = 1;
        *(undefined4 *)(kdtree_partition.points_ + uVar5 * 4) = 1;
        Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
                  (this,&self);
        Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
        push_back(&this_00->nbr_bounds_,domain);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                  (&local_358,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&partners);
        RegularLink<diy::Bounds<float>_>::add_direction(this_00,(Direction *)&local_358);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_358);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                  (&local_398,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&kdtree_partition
                  );
        Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                  (&this_00->wrap_,(value_type *)&local_398);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_398);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector
                  ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&kdtree_partition);
        itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector
                  ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&partners);
      }
    }
  }
  kdtree_partition.dim_ = dim;
  kdtree_partition.points_ = points;
  kdtree_partition.samples_ = samples;
  detail::KDTreePartners::KDTreePartners(&partners,dim,assigner->nblocks_,wrap,domain);
  reduce<diy::detail::KDTreeSamplingPartition<Block,diy::Point<float,2u>>,diy::detail::KDTreePartners>
            (master,assigner,&partners,&kdtree_partition);
  iVar3 = 0;
  for (lVar4 = 0;
      lVar4 < (int)((ulong)((long)(master->blocks_).elements_.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(master->blocks_).elements_.
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3); lVar4 = lVar4 + 1) {
    iVar1 = Link::size_unique((master->links_).
                              super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar4]);
    iVar3 = iVar3 + iVar1;
  }
  master->expected_ = iVar3;
  detail::KDTreePartners::~KDTreePartners(&partners);
  return;
}

Assistant:

void kdtree_sampling
               (Master&                         master,      //!< master object
                const Assigner&                 assigner,    //!< assigner object
                int                             dim,         //!< dimensionality
                const ContinuousBounds&         domain,      //!< global data extents
                std::vector<Point>  Block::*    points,      //!< input points to sort into kd-tree
                size_t                          samples,     //!< number of samples to take in each block
                bool                            wrap = false)//!< periodic boundaries in all dimensions
    {
        if (assigner.nblocks() & (assigner.nblocks() - 1))
            throw std::runtime_error(fmt::format("KD-tree requires a number of blocks that's a power of 2, got {}", assigner.nblocks()));

        typedef     diy::RegularContinuousLink      RCLink;

        for (int i = 0; i < static_cast<int>(master.size()); ++i)
        {
            RCLink* link   = static_cast<RCLink*>(master.link(i));
            *link = RCLink(dim, domain, domain);

            if (wrap)       // set up the links to self
            {
                diy::BlockID self = { master.gid(i), master.communicator().rank() };
                for (int j = 0; j < dim; ++j)
                {
                    diy::Direction dir(dim,0), wrap_dir(dim,0);

                    // left
                    dir[j] = -1; wrap_dir[j] = -1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);

                    // right
                    dir[j] = 1; wrap_dir[j] = 1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);
                }
            }
        }

        detail::KDTreeSamplingPartition<Block,Point>    kdtree_partition(dim, points, samples);

        detail::KDTreePartners                          partners(dim, assigner.nblocks(), wrap, domain);
        reduce(master, assigner, partners, kdtree_partition);

        // update master.expected to match the links
        int expected = 0;
        for (int i = 0; i < static_cast<int>(master.size()); ++i)
            expected += master.link(i)->size_unique();
        master.set_expected(expected);
    }